

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

void mpr_print_n1_set(nhdp_domain *domain,avl_tree *set)

{
  _func_int_void_ptr_void_ptr *p_Var1;
  undefined8 uVar2;
  avl_tree *paVar3;
  long lVar4;
  ulong uVar5;
  netaddr_str buf1;
  
  paVar3 = set;
  while (paVar3 = (avl_tree *)(paVar3->list_head).next,
        (paVar3->list_head).prev != (set->list_head).prev) {
    uVar5 = (ulong)LOG_MPR;
    if (((&log_global_mask)[uVar5] & 1) != 0) {
      p_Var1 = paVar3[-1].comp;
      lVar4 = (long)domain->index * 0x20;
      uVar2 = netaddr_to_prefixstring(&buf1,paVar3 + -1,0);
      oonf_log(1,uVar5,"src/nhdp/mpr/neighbor-graph.c",0xf2,0,0,"%s in: %u out: %u",uVar2,
               *(undefined4 *)(p_Var1 + lVar4 + 0xe0),*(undefined4 *)(p_Var1 + lVar4 + 0xe4));
    }
  }
  return;
}

Assistant:

void
mpr_print_n1_set(struct nhdp_domain *domain __attribute__((unused)), struct avl_tree *set) {
  struct n1_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct nhdp_neighbor_domaindata *neighbordata;
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
#ifdef OONF_LOG_DEBUG_INFO
    neighbordata = nhdp_domain_get_neighbordata(domain, current_node->neigh);

    OONF_DEBUG(LOG_MPR, "%s in: %u out: %u", netaddr_to_string(&buf1, &current_node->addr), neighbordata->metric.in,
      neighbordata->metric.out);
#endif
  }
}